

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

Time __thiscall helics::apps::Source::runSourceLoop(Source *this,Time currentTime)

{
  bool bVar1;
  baseType in_RSI;
  _Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
  *in_RDI;
  Time tm;
  SourceObject *src_1;
  iterator __end2;
  iterator __begin2;
  deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *__range2;
  SourceObject *src;
  iterator __end3;
  iterator __begin3;
  deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *__range3;
  Time minTime;
  deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
  *in_stack_ffffffffffffff18;
  TimeRepresentation<count_time<9,_long>_> local_d0;
  reference local_c8;
  _Self local_c0;
  _Self local_a0;
  _Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
  *local_80;
  baseType local_78;
  baseType local_70;
  reference local_68;
  SourceObject *in_stack_ffffffffffffffb8;
  Source *in_stack_ffffffffffffffc0;
  Time in_stack_ffffffffffffffc8;
  TimeRepresentation<count_time<9,_long>_> local_10;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_10.internalTimeCode = in_RSI;
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                    (&local_10,(TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
  if (bVar1) {
    CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::begin
              (in_stack_ffffffffffffff18);
    CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::end
              (in_stack_ffffffffffffff18);
    while (bVar1 = CLI::std::operator==
                             ((_Self *)&stack0xffffffffffffffc0,(_Self *)&stack0xffffffffffffffa0),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      local_68 = CLI::std::
                 _Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
                 ::operator*((_Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
                              *)&stack0xffffffffffffffc0);
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                        (&local_68->nextTime,
                         (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
      if (bVar1) {
        local_70 = local_10.internalTimeCode;
        local_78 = (baseType)
                   runSource(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                             in_stack_ffffffffffffffc8);
        (local_68->nextTime).internalTimeCode = 0;
      }
      CLI::std::
      _Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
      ::operator++(in_RDI);
    }
    local_8.internalTimeCode = 0;
  }
  else {
    local_8.internalTimeCode = 0x7fffffffffffffff;
    local_80 = in_RDI + 5;
    CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::begin
              (in_stack_ffffffffffffff18);
    CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::end
              (in_stack_ffffffffffffff18);
    while (bVar1 = CLI::std::operator==(&local_a0,&local_c0), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_c8 = CLI::std::
                 _Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
                 ::operator*(&local_a0);
      local_d0.internalTimeCode =
           (baseType)
           runSource(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc8);
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&local_d0,&local_8);
      if (bVar1) {
        local_8.internalTimeCode = local_d0.internalTimeCode;
      }
      CLI::std::
      _Deque_iterator<helics::apps::SourceObject,_helics::apps::SourceObject_&,_helics::apps::SourceObject_*>
      ::operator++(in_RDI);
    }
  }
  return (Time)local_8.internalTimeCode;
}

Assistant:

Time Source::runSourceLoop(Time currentTime)
    {
        if (currentTime < timeZero) {
            for (auto& src : sources) {
                if (src.nextTime < timeZero) {
                    runSource(src, currentTime);
                    src.nextTime = timeZero;
                }
            }
            return timeZero;
        }
        Time minTime = Time::maxVal();
        for (auto& src : sources) {
            auto tm = runSource(src, currentTime);
            if (tm < minTime) {
                minTime = tm;
            }
        }
        return minTime;
    }